

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int skipcomment(FILE *f,int *cp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = getc((FILE *)f);
  if (iVar1 == 0xef) {
    iVar2 = getc((FILE *)f);
    iVar1 = 0;
    iVar3 = 0xef;
    if ((iVar2 != 0xbb) || (iVar2 = getc((FILE *)f), iVar2 != 0xbf)) goto LAB_00116338;
    iVar1 = getc((FILE *)f);
  }
  *cp = iVar1;
  if (iVar1 != 0x23) {
    return 0;
  }
  do {
    iVar1 = getc((FILE *)f);
    if (iVar1 == 10) break;
  } while (iVar1 != -1);
  iVar3 = getc((FILE *)f);
  iVar1 = 1;
LAB_00116338:
  *cp = iVar3;
  return iVar1;
}

Assistant:

static int skipcomment (FILE *f, int *cp) {
  int c = *cp = skipBOM(f);
  if (c == '#') {  /* first line is a comment (Unix exec. file)? */
    do {  /* skip first line */
      c = getc(f);
    } while (c != EOF && c != '\n');
    *cp = getc(f);  /* next character after comment, if present */
    return 1;  /* there was a comment */
  }
  else return 0;  /* no comment */
}